

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O0

bool __thiscall
stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::
executeThread(MicrothreadManager<implementations::brainfck::BFImplementation> *this,
             _threads_iterator thread)

{
  bool bVar1;
  bool bVar2;
  pointer ppVar3;
  CycleCount local_28;
  CycleCount cycle;
  bool executed;
  MicrothreadManager<implementations::brainfck::BFImplementation> *this_local;
  _threads_iterator thread_local;
  
  (this->current_thread)._M_node = thread._M_node;
  bVar1 = false;
  this_local = (MicrothreadManager<implementations::brainfck::BFImplementation> *)thread._M_node;
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>
                         *)&this_local);
  local_28 = (ppVar3->second).cycles;
  while ((local_28 != 0 && (bVar2 = shouldRunThread(this,(_threads_iterator)this_local), bVar2))) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>
                           *)&this_local);
    bVar2 = Microthread<implementations::brainfck::BFImplementation>::execute(&ppVar3->second);
    if (!bVar2) {
      return bVar1;
    }
    bVar1 = true;
    local_28 = local_28 - 1;
  }
  return bVar1;
}

Assistant:

bool executeThread(_threads_iterator thread) {
				current_thread = thread;
				bool executed = false;
				for (CycleCount cycle = thread->second.cycles; cycle > 0; --cycle) {
					if (shouldRunThread(thread) == false)
						return executed;
					if (!thread->second.execute())
						return executed;
					executed = true;
				}
				return executed;
			}